

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  Inst *this_00;
  byte bVar1;
  char *pcVar2;
  undefined8 uVar3;
  Threadq *pTVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  char **ppcVar10;
  Threadq *nextq;
  byte *pbVar11;
  Thread *t0;
  ostream *poVar12;
  pointer pIVar13;
  uint uVar14;
  long lVar15;
  uint32 flag;
  pointer pIVar16;
  char *pcVar17;
  Threadq *runq;
  byte *pbVar18;
  StringPiece context;
  LogMessageFatal local_1b0;
  
  if (this->start_ == 0) {
    return false;
  }
  pcVar17 = const_context->ptr_;
  context.length_ = const_context->length_;
  context._12_4_ = *(undefined4 *)&const_context->field_0xc;
  if (pcVar17 == (char *)0x0) {
    context.length_ = text->length_;
    pcVar17 = text->ptr_;
  }
  pcVar2 = text->ptr_;
  context.ptr_ = pcVar17;
  if (pcVar17 <= pcVar2) {
    pcVar9 = pcVar2 + text->length_;
    if (pcVar9 <= pcVar17 + context.length_) {
      bVar6 = this->prog_->anchor_start_;
      if ((pcVar17 != pcVar2 & bVar6) != 0) {
        return false;
      }
      if (this->prog_->anchor_end_ == true) {
        if (pcVar17 + context.length_ != pcVar9) {
          return false;
        }
        this->endmatch_ = true;
        this->etext_ = pcVar9;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar7 = nsubmatch * 2;
        this->ncapture_ = uVar7;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar7 = 2;
        }
        ppcVar10 = (char **)operator_new__((ulong)uVar7 << 3);
        this->match_ = ppcVar10;
        this->matched_ = false;
        this->btext_ = pcVar17;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        bVar5 = false;
        memset(ppcVar10,0,(ulong)uVar7 << 3);
        if (pcVar17 < pcVar2) {
          bVar5 = Prog::IsWordChar(pcVar2[-1]);
        }
        bVar1 = bVar6 | anchored;
        pbVar18 = (byte *)text->ptr_;
        pTVar4 = &this->q1_;
        runq = &this->q0_;
        do {
          nextq = pTVar4;
          uVar7 = 5;
          if ((pbVar18 != (byte *)context.ptr_) &&
             (uVar7 = 0, pbVar18 <= context.ptr_ + context.length_)) {
            uVar7 = (uint)(pbVar18[-1] == 10);
          }
          pbVar11 = (byte *)(context.ptr_ + context.length_);
          if (pbVar18 == pbVar11) {
            uVar14 = uVar7 | 10;
          }
          else {
            uVar14 = uVar7;
            if ((pbVar18 < pbVar11) && (uVar14 = uVar7 | 2, *pbVar18 != 10)) {
              uVar14 = uVar7;
            }
          }
          bVar6 = false;
          if (pbVar18 < pbVar11) {
            bVar6 = Prog::IsWordChar(*pbVar18);
          }
          uVar7 = 0xffffffff;
          if (pbVar18 < text->ptr_ + text->length_) {
            uVar7 = (uint)*pbVar18;
          }
          flag = uVar14 + (uint)(bVar6 == bVar5) * 0x10 + 0x10;
          uVar7 = Step(this,runq,nextq,uVar7,flag,(char *)(pbVar18 + -1));
          if (runq->size_ != 0) {
            __assert_fail("(runq->size()) == (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0x22b,
                          "bool re2::NFA::Search(const StringPiece &, const StringPiece &, bool, bool, StringPiece *, int)"
                         );
          }
          pbVar11 = (byte *)(text->ptr_ + text->length_);
          if (uVar7 != 0) goto LAB_00140ec1;
          if (pbVar11 < pbVar18) break;
          bVar5 = bVar6;
          if (((bVar1 & pbVar18 != (byte *)text->ptr_) == 0) && (this->matched_ == false)) {
            uVar7 = Prog::first_byte(this->prog_);
            if (((bVar1 == 0) &&
                (((-1 < (int)uVar7 && (nextq->size_ == 0)) &&
                 (pbVar11 = (byte *)(text->ptr_ + text->length_), pbVar18 < pbVar11)))) &&
               (uVar7 != *pbVar18)) {
              pbVar18 = (byte *)memchr(pbVar18,uVar7,(long)pbVar11 - (long)pbVar18);
              if (pbVar18 == (byte *)0x0) {
                bVar6 = false;
              }
              else {
                bVar6 = Prog::IsWordChar(*pbVar18);
                pbVar11 = pbVar18;
              }
              flag = Prog::EmptyFlags(&context,(char *)pbVar11);
              pbVar18 = pbVar11;
            }
            t0 = AllocThread(this);
            CopyCapture(this,t0->capture,this->match_);
            *t0->capture = (char *)pbVar18;
            uVar7 = 0xffffffff;
            if (pbVar18 < text->ptr_ + text->length_) {
              uVar7 = (uint)*pbVar18;
            }
            AddToThreadq(this,nextq,this->start_,uVar7,flag,(char *)pbVar18,t0);
            Decref(this,t0);
            bVar5 = bVar6;
          }
          pbVar18 = pbVar18 + 1;
          pTVar4 = runq;
          runq = nextq;
        } while (nextq->size_ != 0);
        goto LAB_00141013;
      }
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1d1
                );
      poVar12 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Bad args: nsubmatch=");
      std::ostream::operator<<(poVar12,nsubmatch);
      goto LAB_00140f83;
    }
  }
  LogMessageFatal::LogMessageFatal
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1bd);
  poVar12 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                            "Bad args: context does not contain text ");
  poVar12 = std::ostream::_M_insert<void_const*>(poVar12);
  poVar12 = std::operator<<(poVar12,"+");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,context.length_);
  poVar12 = std::operator<<(poVar12," ");
  poVar12 = std::ostream::_M_insert<void_const*>(poVar12);
  poVar12 = std::operator<<(poVar12,"+");
  std::ostream::operator<<(poVar12,text->length_);
LAB_00140f83:
  LogMessageFatal::~LogMessageFatal(&local_1b0);
  return false;
LAB_00140ec1:
  this_00 = this->prog_->inst_ + (int)uVar7;
  uVar7 = this_00->out_opcode_;
  uVar14 = uVar7 & 7;
  if (uVar14 == 3) {
    iVar8 = Prog::Inst::cap(this_00);
    if (iVar8 < this->ncapture_) {
      ppcVar10 = this->match_;
      iVar8 = Prog::Inst::cap(this_00);
      ppcVar10[iVar8] = (char *)pbVar11;
    }
    uVar7 = this_00->out_opcode_;
  }
  else if (uVar14 != 6) goto code_r0x00140edf;
  uVar7 = uVar7 >> 4;
  goto LAB_00140ec1;
code_r0x00140edf:
  if (uVar14 == 5) {
    this->match_[1] = (char *)pbVar11;
    this->matched_ = true;
  }
  else {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x235);
    poVar12 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                              "Unexpected opcode in short circuit: ");
    std::ostream::operator<<(poVar12,this_00->out_opcode_ & 7);
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
LAB_00141013:
  pIVar13 = (nextq->dense_).
            super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pIVar16 = pIVar13; pIVar16 != pIVar13 + nextq->size_; pIVar16 = pIVar16 + 1) {
    Decref(this,pIVar16->second);
    pIVar13 = (nextq->dense_).
              super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (this->matched_ != true) {
    return false;
  }
  ppcVar10 = this->match_;
  for (lVar15 = 0; (ulong)(uint)nsubmatch << 4 != lVar15; lVar15 = lVar15 + 0x10) {
    uVar3 = *(undefined8 *)((long)ppcVar10 + lVar15);
    iVar8 = *(int *)((long)ppcVar10 + lVar15 + 8);
    *(undefined8 *)((long)&submatch->ptr_ + lVar15) = uVar3;
    *(int *)((long)&submatch->length_ + lVar15) = iVar8 - (int)uVar3;
  }
  return true;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;

  if (!StringPieceContains(context, text)) {
    LOG(FATAL) << "Bad args: context does not contain text "
                << reinterpret_cast<const void*>(context.begin())
                << "+" << context.size() << " "
                << reinterpret_cast<const void*>(text.begin())
                << "+" << text.size();
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
    etext_ = text.end();
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.begin();

  if (Debug) {
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            text.as_string().c_str(), context.as_string().c_str(), anchored,
            longest);
  }

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);
  int wasword = 0;

  if (text.begin() > context.begin())
    wasword = Prog::IsWordChar(text.begin()[-1] & 0xFF);

  // Loop over the text, stepping the machine.
  for (const char* p = text.begin();; p++) {
    // Check for empty-width specials.
    int flag = 0;

    // ^ and \A
    if (p == context.begin())
      flag |= kEmptyBeginText | kEmptyBeginLine;
    else if (p <= context.end() && p[-1] == '\n')
      flag |= kEmptyBeginLine;

    // $ and \z
    if (p == context.end())
      flag |= kEmptyEndText | kEmptyEndLine;
    else if (p < context.end() && p[0] == '\n')
      flag |= kEmptyEndLine;

    // \b and \B
    int isword = 0;
    if (p < context.end())
      isword = Prog::IsWordChar(p[0] & 0xFF);

    if (isword != wasword)
      flag |= kEmptyWordBoundary;
    else
      flag |= kEmptyNonWordBoundary;

    if (Debug) {
      int c = 0;
      if (p == context.begin())
        c = '^';
      else if (p > text.end())
        c = '$';
      else if (p < text.end())
        c = p[0] & 0xFF;

      fprintf(stderr, "%c[%#x/%d/%d]:", c, flag, isword, wasword);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->second;
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // Note that we pass p-1 to Step() because it needs the previous pointer
    // value in order to handle Match instructions appropriately. It plumbs
    // c and flag through to AddToThreadq() along with p-1+1, which is p.
    //
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < text.end() ? p[0] & 0xFF : -1, flag, p-1);
    DCHECK_EQ(runq->size(), 0);
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = text.end();
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > text.end())
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.begin())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
        if (p == NULL) {
          p = text.end();
          isword = 0;
        } else {
          isword = Prog::IsWordChar(p[0] & 0xFF);
        }
        flag = Prog::EmptyFlags(context, p);
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < text.end() ? p[0] & 0xFF : -1, flag, p, t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (Debug)
        fprintf(stderr, "dead\n");
      break;
    }

    wasword = isword;
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->second);

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i].set(match_[2*i],
                      static_cast<int>(match_[2*i+1] - match_[2*i]));
    if (Debug)
      fprintf(stderr, "match (%d,%d)\n",
              static_cast<int>(match_[0] - btext_),
              static_cast<int>(match_[1] - btext_));
    return true;
  }
  VLOG(1) << "No matches found";
  return false;
}